

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_node.c
# Opt level: O0

REF_STATUS ref_node_tri_darea_dnode0(REF_NODE ref_node,REF_INT *nodes,REF_DBL *area,REF_DBL *d_area)

{
  double *pdVar1;
  double *pdVar2;
  double *pdVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  int local_fc;
  REF_STATUS ref_private_macro_code_rss;
  REF_INT i;
  REF_DBL d_normz [3];
  REF_DBL d_normy [3];
  REF_DBL d_normx [3];
  REF_DBL normz;
  REF_DBL normy;
  REF_DBL normx;
  REF_DBL v1 [3];
  REF_DBL v0 [3];
  REF_DBL *xyz2;
  REF_DBL *xyz1;
  REF_DBL *xyz0;
  REF_DBL *d_area_local;
  REF_DBL *area_local;
  REF_INT *nodes_local;
  REF_NODE ref_node_local;
  
  if ((((((*nodes < 0) || (ref_node->max <= *nodes)) || (ref_node->global[*nodes] < 0)) ||
       ((nodes[1] < 0 || (ref_node->max <= nodes[1])))) ||
      ((ref_node->global[nodes[1]] < 0 || ((nodes[2] < 0 || (ref_node->max <= nodes[2])))))) ||
     (ref_node->global[nodes[2]] < 0)) {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c",0x955,
           "ref_node_tri_darea_dnode0",3,"node invalid");
    ref_node_local._4_4_ = 3;
  }
  else {
    pdVar1 = ref_node->real + *nodes * 0xf;
    pdVar2 = ref_node->real + nodes[1] * 0xf;
    pdVar3 = ref_node->real + nodes[2] * 0xf;
    dVar4 = *pdVar2 - *pdVar1;
    _ref_private_macro_code_rss = pdVar2[1] - pdVar1[1];
    dVar5 = pdVar2[2] - pdVar1[2];
    dVar6 = *pdVar3 - *pdVar1;
    dVar7 = pdVar3[1] - pdVar1[1];
    dVar8 = pdVar3[2] - pdVar1[2];
    dVar9 = _ref_private_macro_code_rss * dVar8 + -(dVar5 * dVar7);
    d_normx[0] = -dVar8 + dVar5;
    d_normx[1] = -_ref_private_macro_code_rss + dVar7;
    dVar5 = dVar5 * dVar6 + -(dVar4 * dVar8);
    d_normy[0] = 0.0;
    d_normy[1] = -dVar6 + dVar4;
    d_normx[2] = dVar4 * dVar7 + -(_ref_private_macro_code_rss * dVar6);
    _ref_private_macro_code_rss = -dVar7 + _ref_private_macro_code_rss;
    d_normz[0] = -dVar4 + dVar6;
    d_normz[1] = 0.0;
    dVar4 = sqrt(d_normx[2] * d_normx[2] + dVar9 * dVar9 + dVar5 * dVar5);
    *area = dVar4 * 0.5;
    for (local_fc = 0; local_fc < 3; local_fc = local_fc + 1) {
      dVar4 = sqrt(d_normx[2] * d_normx[2] + dVar9 * dVar9 + dVar5 * dVar5);
      d_area[local_fc] =
           (0.25 / dVar4) *
           (d_normx[2] * 2.0 * *(double *)(&ref_private_macro_code_rss + (long)local_fc * 2) +
           dVar9 * 2.0 * d_normx[(long)local_fc + -1] + dVar5 * 2.0 * d_normy[(long)local_fc + -1]);
    }
    ref_node_local._4_4_ = 0;
  }
  return ref_node_local._4_4_;
}

Assistant:

REF_FCN REF_STATUS ref_node_tri_darea_dnode0(REF_NODE ref_node, REF_INT *nodes,
                                             REF_DBL *area, REF_DBL *d_area) {
  REF_DBL *xyz0, *xyz1, *xyz2;
  REF_DBL v0[3], v1[3];
  REF_DBL normx, normy, normz;
  REF_DBL d_normx[3], d_normy[3], d_normz[3];
  REF_INT i;

  if (!ref_node_valid(ref_node, nodes[0]) ||
      !ref_node_valid(ref_node, nodes[1]) ||
      !ref_node_valid(ref_node, nodes[2]))
    RSS(REF_INVALID, "node invalid");

  xyz0 = ref_node_xyz_ptr(ref_node, nodes[0]);
  xyz1 = ref_node_xyz_ptr(ref_node, nodes[1]);
  xyz2 = ref_node_xyz_ptr(ref_node, nodes[2]);

  v0[0] = xyz1[0] - xyz0[0];
  v0[1] = xyz1[1] - xyz0[1];
  v0[2] = xyz1[2] - xyz0[2];

  v1[0] = xyz2[0] - xyz0[0];
  v1[1] = xyz2[1] - xyz0[1];
  v1[2] = xyz2[2] - xyz0[2];

  normx = (v0)[1] * (v1)[2] - (v0)[2] * (v1)[1];
  d_normx[0] = 0.0;
  d_normx[1] = -(v1)[2] + (v0)[2];
  d_normx[2] = -(v0)[1] + (v1)[1];

  normy = (v0)[2] * (v1)[0] - (v0)[0] * (v1)[2];
  d_normy[0] = -(v0)[2] + (v1)[2];
  d_normy[1] = 0.0;
  d_normy[2] = -(v1)[0] + (v0)[0];

  normz = (v0)[0] * (v1)[1] - (v0)[1] * (v1)[0];
  d_normz[0] = -(v1)[1] + (v0)[1];
  d_normz[1] = -(v0)[0] + (v1)[0];
  d_normz[2] = 0.0;

  *area = 0.5 * sqrt(normx * normx + normy * normy + normz * normz);
  for (i = 0; i < 3; i++)
    d_area[i] = 0.5 * 0.5 /
                sqrt(normx * normx + normy * normy + normz * normz) *
                (2.0 * normx * d_normx[i] + 2.0 * normy * d_normy[i] +
                 2.0 * normz * d_normz[i]);

  return REF_SUCCESS;
}